

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_buffer_on_shmem.cpp
# Opt level: O0

int64_t __thiscall
SharedMemRingBuffer::ClaimIndex
          (SharedMemRingBuffer *this,size_t want_len,size_t *out_position_to_write)

{
  size_t sVar1;
  _PositionInfo_ **pp_Var2;
  __int_type_conflict _Var3;
  size_t *in_RDX;
  ulong in_RSI;
  SharedMemRingBuffer *in_RDI;
  int64_t gating_seq;
  int64_t wrap_point;
  int64_t next_seq_for_claim;
  ENUM_DATA_STATUS data_status;
  int64_t *in_stack_ffffffffffffff88;
  RingBuffer<_PositionInfo__*> *in_stack_ffffffffffffff90;
  RingBuffer<_PositionInfo__*> *this_00;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 uVar4;
  SharedMemRingBuffer *in_stack_ffffffffffffffa8;
  ENUM_DATA_STATUS local_24;
  int64_t local_8;
  
  if (in_RDI->max_data_size_ < in_RSI) {
    local_8 = -1;
  }
  else {
    local_24 = DATA_EMPTY;
    local_8 = GetNextSequenceForClaim(in_RDI);
    pp_Var2 = RingBuffer<_PositionInfo__*>::operator[]
                        (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    (*pp_Var2)->status = DATA_EMPTY;
    sVar1 = in_RDI->buffer_size_;
    while( true ) {
      while( true ) {
        while( true ) {
          this_00 = in_stack_ffffffffffffff90;
          if (0 < local_8) {
            pp_Var2 = RingBuffer<_PositionInfo__*>::operator[]
                                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
            local_24 = (*pp_Var2)->status;
            this_00 = in_stack_ffffffffffffff90;
          }
          in_stack_ffffffffffffff90 =
               (RingBuffer<_PositionInfo__*> *)GetMinIndexOfConsumers(in_stack_ffffffffffffffa8);
          if ((long)(local_8 - sVar1) < (long)in_stack_ffffffffffffff90) break;
          std::this_thread::yield();
          in_stack_ffffffffffffff90 = this_00;
        }
        if ((local_8 < 1) || (local_24 != DATA_EMPTY)) break;
        std::this_thread::yield();
        in_stack_ffffffffffffff90 = this_00;
      }
      if (local_8 == 0) {
        *in_RDX = 0;
      }
      else {
        pp_Var2 = RingBuffer<_PositionInfo__*>::operator[](this_00,in_stack_ffffffffffffff88);
        *in_RDX = (*pp_Var2)->offset_position;
      }
      uVar4 = false;
      if (0 < local_8) {
        in_stack_ffffffffffffffa8 = (SharedMemRingBuffer *)(local_8 + -1);
        pp_Var2 = RingBuffer<_PositionInfo__*>::operator[](this_00,in_stack_ffffffffffffff88);
        uVar4 = in_RDI->raw_mem_buffer_capacity_ < (*pp_Var2)->offset_position + in_RSI;
      }
      if ((bool)uVar4 == false) {
        return local_8;
      }
      if ((in_stack_ffffffffffffff90 == (RingBuffer<_PositionInfo__*> *)0x0) ||
         (_Var3 = std::__atomic_base::operator_cast_to_long
                            ((__atomic_base<long> *)CONCAT17(uVar4,in_stack_ffffffffffffff98)),
         _Var3 <= (long)in_stack_ffffffffffffff90)) break;
      std::this_thread::yield();
    }
    std::__atomic_base<long>::operator=
              ((__atomic_base<long> *)in_RDI,CONCAT17(uVar4,in_stack_ffffffffffffff98));
    *in_RDX = 0;
  }
  return local_8;
}

Assistant:

int64_t SharedMemRingBuffer::ClaimIndex(size_t want_len, size_t * out_position_to_write )
{
    if( want_len > max_data_size_ ) {
        DEBUG_ELOG("Error: Invalid data length : exceeds MAX : " << max_data_size_); 
        return -1;
    }
    ENUM_DATA_STATUS data_status = DATA_EMPTY;
    int64_t next_seq_for_claim = GetNextSequenceForClaim() ;
    ring_buffer_[next_seq_for_claim]->status =DATA_EMPTY; //init
    //다음 쓰기 위치 - 링버퍼 크기 = 링버퍼 한번 순회 이전위치, 
    //데이터 쓰기 작업이 링버퍼를 완전히 한바퀴 순회한 경우
    //여기서 더 진행하면 데이터를 이전 덮어쓰게 된다.
    //만약 아직 데이터를 read하지 못한 상태
    //(min customer index가 wrap position보다 작거나 같은 경우)라면 쓰기 작업은 대기해야 한다
    int64_t wrap_point = next_seq_for_claim - buffer_size_;

    do {
        if(next_seq_for_claim>0) {
            data_status = ring_buffer_[next_seq_for_claim-1]->status ;
        }

        int64_t gating_seq = GetMinIndexOfConsumers();
        if  ( wrap_point >=  gating_seq ) {
            std::this_thread::yield();
            continue;
        } else if  ( next_seq_for_claim>0 && data_status == DATA_EMPTY ) {
            //because of arbitrary data length, we need to wait until previous data is set 

            std::this_thread::yield();
            DEBUG_LOG("continue , DATA_EMPTY / next_seq_for_claim:" << next_seq_for_claim); 
            continue;
        } else {
            //calculate out_position_to_write
            if(next_seq_for_claim==0) {
                *out_position_to_write = 0;
            } else {
                *out_position_to_write = ring_buffer_[next_seq_for_claim-1]->offset_position ;
                DEBUG_LOG("write pos: "<< *out_position_to_write); 
            }

            if( next_seq_for_claim>0 && 
                ring_buffer_[next_seq_for_claim-1]->offset_position + want_len > raw_mem_buffer_capacity_ ) {
                //last write position + wanted data length > total data buffer size 
                //--> start from 0 position  
                DEBUG_LOG( "prev_reset_pos : "<< ring_buffer_status_on_shared_mem_->prev_reset_pos); 
                if( gating_seq!=0 && 
                    gating_seq < ring_buffer_status_on_shared_mem_->prev_reset_pos ) {
                    //but don't over-write customer data 
                    //'gating_seq == 0' means a consumer read index 0, so it is OK to write at index 0
                    
                    std::this_thread::yield();
                    DEBUG_LOG( "spin... / gating_seq=" << gating_seq
                          << " / next_seq_for_claim= "<< next_seq_for_claim 
                          << " / ring_buffer_status_on_shared_mem_->prev_reset_pos=" 
                          << ring_buffer_status_on_shared_mem_->prev_reset_pos ); 
                    continue;
                }
                ring_buffer_status_on_shared_mem_->prev_reset_pos = next_seq_for_claim ;
                DEBUG_LOG("raw_mem_buffer_capacity_ :"<< raw_mem_buffer_capacity_ 
                          << " / gating_seq: "<< gating_seq << " / want_len:"
                          << want_len <<" / ring_buffer_[gating_seq]->start_position: "
                          << ring_buffer_[gating_seq]->start_position );
                DEBUG_LOG( "reset pos 0 "); 
                *out_position_to_write = 0;
            }
            break;
        }
    } while (true);

    DEBUG_LOG("RETURN next_seq_for_claim:" << next_seq_for_claim ); 
    return next_seq_for_claim;
}